

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.c
# Opt level: O2

axbStatus_t axbOpBackendRegister_Host(axbHandle_s *handle)

{
  uint uVar1;
  char *pcVar2;
  axbOperationID_t op_id;
  axbOpBackend_s *host_backend;
  axbOperationID_t local_14;
  axbOpBackend_s *local_10;
  
  uVar1 = axbOpBackendCreate(&local_10);
  if (uVar1 != 0) {
    fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
            ,0x228,(ulong)uVar1);
    __assert_fail("status==0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                  ,0x228,"axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)");
  }
  uVar1 = axbOpBackendSetName(local_10,"host");
  if (uVar1 == 0) {
    local_14 = 0;
    uVar1 = axbOpBackendAddOperation(local_10,"op_vec_set",op_vec_set,(void *)0x0,&local_14);
    if (uVar1 == 0) {
      if (local_14 == 0) {
        uVar1 = axbOpBackendAddOperation
                          (local_10,"op_vec_sqrtabs",op_vec_sqrtabs,(void *)0x0,&local_14);
        if (uVar1 == 0) {
          if (local_14 == 1) {
            uVar1 = axbOpBackendAddOperation
                              (local_10,"op_vec_zero",op_vec_zero,(void *)0x0,&local_14);
            if (uVar1 == 0) {
              if (local_14 == 2) {
                uVar1 = axbOpBackendAddOperation
                                  (local_10,"op_vec_scale",op_vec_scale,(void *)0x0,&local_14);
                if (uVar1 == 0) {
                  if (local_14 == 3) {
                    uVar1 = axbOpBackendAddOperation
                                      (local_10,"op_vec_sum",op_vec_sum,(void *)0x0,&local_14);
                    if (uVar1 == 0) {
                      if (local_14 == 4) {
                        uVar1 = axbOpBackendAddOperation
                                          (local_10,"op_vec_dot",op_vec_dot,(void *)0x0,&local_14);
                        if (uVar1 == 0) {
                          if (local_14 == 5) {
                            uVar1 = axbOpBackendAddOperation
                                              (local_10,"op_vec_tdot",op_vec_tdot,(void *)0x0,
                                               &local_14);
                            if (uVar1 == 0) {
                              if (local_14 == 6) {
                                uVar1 = axbOpBackendAddOperation
                                                  (local_10,"op_vec_mdot",op_vec_mdot,(void *)0x0,
                                                   &local_14);
                                if (uVar1 == 0) {
                                  if (local_14 == 7) {
                                    uVar1 = axbOpBackendAddOperation
                                                      (local_10,"op_vec_norm1",op_vec_norm1,
                                                       (void *)0x0,&local_14);
                                    if (uVar1 == 0) {
                                      if (local_14 == 8) {
                                        uVar1 = axbOpBackendAddOperation
                                                          (local_10,"op_vec_norm2",op_vec_norm2,
                                                           (void *)0x0,&local_14);
                                        if (uVar1 == 0) {
                                          if (local_14 == 9) {
                                            uVar1 = axbOpBackendAddOperation
                                                              (local_10,"op_vec_norminf",
                                                               op_vec_norminf,(void *)0x0,&local_14)
                                            ;
                                            if (uVar1 == 0) {
                                              if (local_14 == 10) {
                                                uVar1 = axbOpBackendAddOperation
                                                                  (local_10,"op_vec_dotnorm2",
                                                                   op_vec_dotnorm2,(void *)0x0,
                                                                   &local_14);
                                                if (uVar1 == 0) {
                                                  if (local_14 == 0xb) {
                                                    uVar1 = axbOpBackendAddOperation
                                                                      (local_10,"op_vec_max",
                                                                       op_vec_max,(void *)0x0,
                                                                       &local_14);
                                                    if (uVar1 == 0) {
                                                      if (local_14 == 0xc) {
                                                        uVar1 = axbOpBackendAddOperation
                                                                          (local_10,"op_vec_min",
                                                                           op_vec_min,(void *)0x0,
                                                                           &local_14);
                                                        if (uVar1 == 0) {
                                                          if (local_14 == 0xd) {
                                                            uVar1 = axbOpBackendAddOperation
                                                                              (local_10,
                                                  "op_vec_copy",op_vec_copy,(void *)0x0,&local_14);
                                                  if (uVar1 == 0) {
                                                    if (local_14 == 0xe) {
                                                      uVar1 = axbOpBackendAddOperation
                                                                        (local_10,"op_vec_swap",
                                                                         op_vec_swap,(void *)0x0,
                                                                         &local_14);
                                                      if (uVar1 == 0) {
                                                        if (local_14 == 0xf) {
                                                          uVar1 = axbOpBackendAddOperation
                                                                            (local_10,"op_vec_axpy",
                                                                             op_vec_axpy,(void *)0x0
                                                                             ,&local_14);
                                                          if (uVar1 == 0) {
                                                            if (local_14 == 0x10) {
                                                              uVar1 = axbOpBackendAddOperation
                                                                                (local_10,
                                                  "op_vec_aypx",op_vec_aypx,(void *)0x0,&local_14);
                                                  if (uVar1 == 0) {
                                                    if (local_14 == 0x11) {
                                                      uVar1 = axbOpBackendAddOperation
                                                                        (local_10,"op_vec_axpbypcz",
                                                                         op_vec_axpbypcz,(void *)0x0
                                                                         ,&local_14);
                                                      if (uVar1 == 0) {
                                                        if (local_14 == 0x12) {
                                                          uVar1 = axbOpBackendAddOperation
                                                                            (local_10,"op_vec_waxpy"
                                                                             ,op_vec_waxpy,
                                                                             (void *)0x0,&local_14);
                                                          if (uVar1 == 0) {
                                                            if (local_14 == 0x13) {
                                                              uVar1 = axbOpBackendAddOperation
                                                                                (local_10,
                                                  "op_vec_maxpy",op_vec_maxpy,(void *)0x0,&local_14)
                                                  ;
                                                  if (uVar1 == 0) {
                                                    if (local_14 == 0x14) {
                                                      uVar1 = axbOpBackendAddOperation
                                                                        (local_10,
                                                  "op_vec_pointwisemult",op_vec_pointwisemult,
                                                  (void *)0x0,&local_14);
                                                  if (uVar1 == 0) {
                                                    if (local_14 == 0x15) {
                                                      uVar1 = axbOpBackendAddOperation
                                                                        (local_10,
                                                  "op_vec_pointwisediv",op_vec_pointwisediv,
                                                  (void *)0x0,&local_14);
                                                  if (uVar1 == 0) {
                                                    if (local_14 == 0x16) {
                                                      uVar1 = axbOpBackendAddOperation
                                                                        (local_10,"op_mat_csr_vec",
                                                                         op_mat_csr_vec,(void *)0x0,
                                                                         &local_14);
                                                      if (uVar1 == 0) {
                                                        if (local_14 == 0x17) {
                                                          uVar1 = axbOpBackendAddOperation
                                                                            (local_10,
                                                  "op_mat_csr_tvec",op_mat_csr_tvec,(void *)0x0,
                                                  &local_14);
                                                  if (uVar1 == 0) {
                                                    if (local_14 == 0x18) {
                                                      uVar1 = axbOpBackendAddOperation
                                                                        (local_10,"op_mat_csr_mat",
                                                                         op_mat_csr_mat,(void *)0x0,
                                                                         &local_14);
                                                      if (uVar1 == 0) {
                                                        if (local_14 == 0x19) {
                                                          uVar1 = axbOpBackendAddOperation
                                                                            (local_10,
                                                  "op_mat_csr_trans",op_mat_csr_trans,(void *)0x0,
                                                  &local_14);
                                                  if (uVar1 == 0) {
                                                    if (local_14 == 0x1a) {
                                                      uVar1 = axbOpBackendRegister(handle,local_10);
                                                      if (uVar1 == 0) {
                                                        return 0;
                                                      }
                                                      fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,599,(ulong)uVar1);
                                                  __assert_fail("status==0",
                                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,599,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_MAT_TRANS && \"Logic error: op_id != \" \"AXB_OP_MAT_TRANS\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x252,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x252,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_MAT_MAT && \"Logic error: op_id != \" \"AXB_OP_MAT_MAT\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x251,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x251,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_MAT_TVEC && \"Logic error: op_id != \" \"AXB_OP_MAT_TVEC\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x250,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x250,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_MAT_VEC && \"Logic error: op_id != \" \"AXB_OP_MAT_VEC\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x24f,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x24f,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_VEC_POINTWISEDIV && \"Logic error: op_id != \" \"AXB_OP_VEC_POINTWISEDIV\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x24c,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x24c,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_VEC_POINTWISEMULT && \"Logic error: op_id != \" \"AXB_OP_VEC_POINTWISEMULT\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x24b,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x24b,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_VEC_MAXPY && \"Logic error: op_id != \" \"AXB_OP_VEC_MAXPY\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x24a,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x24a,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_VEC_WAXPY && \"Logic error: op_id != \" \"AXB_OP_VEC_WAXPY\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x249,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x249,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_VEC_AXPBYPCZ && \"Logic error: op_id != \" \"AXB_OP_VEC_AXPBYPCZ\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x248,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x248,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_VEC_AYPX && \"Logic error: op_id != \" \"AXB_OP_VEC_AYPX\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x247,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x247,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_VEC_AXPY && \"Logic error: op_id != \" \"AXB_OP_VEC_AXPY\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x246,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x246,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_VEC_SWAP && \"Logic error: op_id != \" \"AXB_OP_VEC_SWAP\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x245,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x245,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_VEC_COPY && \"Logic error: op_id != \" \"AXB_OP_VEC_COPY\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x244,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x244,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_VEC_MIN && \"Logic error: op_id != \" \"AXB_OP_VEC_MIN\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x241,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x241,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_VEC_MAX && \"Logic error: op_id != \" \"AXB_OP_VEC_MAX\""
                                                  ;
                                                  }
                                                  else {
                                                    fprintf(_stderr,
                                                  "ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x240,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                  }
                                                  __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x240,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                                  }
                                                  pcVar2 = 
                                                  "op_id == AXB_OP_VEC_DOTNORM2 && \"Logic error: op_id != \" \"AXB_OP_VEC_DOTNORM2\""
                                                  ;
                                                }
                                                else {
                                                  fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                                                                                                                    
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x23f,(ulong)uVar1);
                                                  pcVar2 = "status==0";
                                                }
                                                __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x23f,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                              }
                                              pcVar2 = 
                                              "op_id == AXB_OP_VEC_NORMINF && \"Logic error: op_id != \" \"AXB_OP_VEC_NORMINF\""
                                              ;
                                            }
                                            else {
                                              fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                                                                                                            
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x23e,(ulong)uVar1);
                                              pcVar2 = "status==0";
                                            }
                                            __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x23e,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                          }
                                          pcVar2 = 
                                          "op_id == AXB_OP_VEC_NORM2 && \"Logic error: op_id != \" \"AXB_OP_VEC_NORM2\""
                                          ;
                                        }
                                        else {
                                          fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x23d,(ulong)uVar1);
                                          pcVar2 = "status==0";
                                        }
                                        __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x23d,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                  );
                                      }
                                      pcVar2 = 
                                      "op_id == AXB_OP_VEC_NORM1 && \"Logic error: op_id != \" \"AXB_OP_VEC_NORM1\""
                                      ;
                                    }
                                    else {
                                      fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                              ,0x23c,(ulong)uVar1);
                                      pcVar2 = "status==0";
                                    }
                                    __assert_fail(pcVar2,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                                  ,0x23c,
                                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                                 );
                                  }
                                  pcVar2 = 
                                  "op_id == AXB_OP_VEC_MDOT && \"Logic error: op_id != \" \"AXB_OP_VEC_MDOT\""
                                  ;
                                }
                                else {
                                  fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                          ,0x23b,(ulong)uVar1);
                                  pcVar2 = "status==0";
                                }
                                __assert_fail(pcVar2,
                                              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                              ,0x23b,
                                              "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                             );
                              }
                              pcVar2 = 
                              "op_id == AXB_OP_VEC_TDOT && \"Logic error: op_id != \" \"AXB_OP_VEC_TDOT\""
                              ;
                            }
                            else {
                              fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                      ,0x23a,(ulong)uVar1);
                              pcVar2 = "status==0";
                            }
                            __assert_fail(pcVar2,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                          ,0x23a,
                                          "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)"
                                         );
                          }
                          pcVar2 = 
                          "op_id == AXB_OP_VEC_DOT && \"Logic error: op_id != \" \"AXB_OP_VEC_DOT\""
                          ;
                        }
                        else {
                          fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                  ,0x239,(ulong)uVar1);
                          pcVar2 = "status==0";
                        }
                        __assert_fail(pcVar2,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                      ,0x239,
                                      "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)")
                        ;
                      }
                      pcVar2 = 
                      "op_id == AXB_OP_VEC_SUM && \"Logic error: op_id != \" \"AXB_OP_VEC_SUM\"";
                    }
                    else {
                      fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                              ,0x238,(ulong)uVar1);
                      pcVar2 = "status==0";
                    }
                    __assert_fail(pcVar2,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                                  ,0x238,
                                  "axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)");
                  }
                  pcVar2 = 
                  "op_id == AXB_OP_VEC_SCALE && \"Logic error: op_id != \" \"AXB_OP_VEC_SCALE\"";
                }
                else {
                  fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                          ,0x235,(ulong)uVar1);
                  pcVar2 = "status==0";
                }
                __assert_fail(pcVar2,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                              ,0x235,"axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)");
              }
              pcVar2 = "op_id == AXB_OP_VEC_ZERO && \"Logic error: op_id != \" \"AXB_OP_VEC_ZERO\"";
            }
            else {
              fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                      ,0x234,(ulong)uVar1);
              pcVar2 = "status==0";
            }
            __assert_fail(pcVar2,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                          ,0x234,"axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)");
          }
          pcVar2 = 
          "op_id == AXB_OP_VEC_SQRTABS && \"Logic error: op_id != \" \"AXB_OP_VEC_SQRTABS\"";
        }
        else {
          fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                  ,0x233,(ulong)uVar1);
          pcVar2 = "status==0";
        }
        __assert_fail(pcVar2,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                      ,0x233,"axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)");
      }
      pcVar2 = "op_id == AXB_OP_VEC_SET && \"Logic error: op_id != \" \"AXB_OP_VEC_SET\"";
    }
    else {
      fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
              ,0x232,(ulong)uVar1);
      pcVar2 = "status==0";
    }
    __assert_fail(pcVar2,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                  ,0x232,"axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)");
  }
  fprintf(_stderr,"ERROR in %s line %d: Code %d.\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
          ,0x22b,(ulong)uVar1);
  __assert_fail("status==0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/src/backend/op/host.c"
                ,0x22b,"axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *)");
}

Assistant:

axbStatus_t axbOpBackendRegister_Host(struct axbHandle_s *handle)
{
  struct axbOpBackend_s *host_backend;
  axbStatus_t status = axbOpBackendCreate(&host_backend); AXB_ERRCHK(status);

  // populate host_backend:
  status = axbOpBackendSetName(host_backend, "host"); AXB_ERRCHK(status);

  axbOperationID_t op_id = 0;

#define AXB_ADD_OPERATION(OPNAME, ENUMCONSTANT)    status = axbOpBackendAddOperation(host_backend, #OPNAME, (axbStatus_t (*)(void))OPNAME, NULL, &op_id); AXB_ERRCHK(status); assert(op_id == ENUMCONSTANT && "Logic error: op_id != " #ENUMCONSTANT)

  // inplace operations
  AXB_ADD_OPERATION(op_vec_set,     AXB_OP_VEC_SET);
  AXB_ADD_OPERATION(op_vec_sqrtabs, AXB_OP_VEC_SQRTABS);
  AXB_ADD_OPERATION(op_vec_zero,    AXB_OP_VEC_ZERO);
  AXB_ADD_OPERATION(op_vec_scale,   AXB_OP_VEC_SCALE);

  // reduction operations
  AXB_ADD_OPERATION(op_vec_sum,      AXB_OP_VEC_SUM);
  AXB_ADD_OPERATION(op_vec_dot,      AXB_OP_VEC_DOT);
  AXB_ADD_OPERATION(op_vec_tdot,     AXB_OP_VEC_TDOT);
  AXB_ADD_OPERATION(op_vec_mdot,     AXB_OP_VEC_MDOT);
  AXB_ADD_OPERATION(op_vec_norm1,    AXB_OP_VEC_NORM1);
  AXB_ADD_OPERATION(op_vec_norm2,    AXB_OP_VEC_NORM2);
  AXB_ADD_OPERATION(op_vec_norminf,  AXB_OP_VEC_NORMINF);
  AXB_ADD_OPERATION(op_vec_dotnorm2, AXB_OP_VEC_DOTNORM2);
  AXB_ADD_OPERATION(op_vec_max,      AXB_OP_VEC_MAX);
  AXB_ADD_OPERATION(op_vec_min,      AXB_OP_VEC_MIN);

  // vector-vector operations
  AXB_ADD_OPERATION(op_vec_copy,          AXB_OP_VEC_COPY);
  AXB_ADD_OPERATION(op_vec_swap,          AXB_OP_VEC_SWAP);
  AXB_ADD_OPERATION(op_vec_axpy,          AXB_OP_VEC_AXPY);
  AXB_ADD_OPERATION(op_vec_aypx,          AXB_OP_VEC_AYPX);
  AXB_ADD_OPERATION(op_vec_axpbypcz,      AXB_OP_VEC_AXPBYPCZ);
  AXB_ADD_OPERATION(op_vec_waxpy,         AXB_OP_VEC_WAXPY);
  AXB_ADD_OPERATION(op_vec_maxpy,         AXB_OP_VEC_MAXPY);
  AXB_ADD_OPERATION(op_vec_pointwisemult, AXB_OP_VEC_POINTWISEMULT);
  AXB_ADD_OPERATION(op_vec_pointwisediv,  AXB_OP_VEC_POINTWISEDIV);

  // matrix operations
  AXB_ADD_OPERATION(op_mat_csr_vec,   AXB_OP_MAT_VEC);
  AXB_ADD_OPERATION(op_mat_csr_tvec,  AXB_OP_MAT_TVEC);
  AXB_ADD_OPERATION(op_mat_csr_mat,   AXB_OP_MAT_MAT);
  AXB_ADD_OPERATION(op_mat_csr_trans, AXB_OP_MAT_TRANS);

#undef AXB_ADD_OPERATION

  // push into enclosing context identified by handle:
  status = axbOpBackendRegister(handle, host_backend); AXB_ERRCHK(status);

  return 0;
}